

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O0

bool ComputeFilter(BlockFilterType filter_type,CBlockIndex *block_index,BlockFilter *filter,
                  BlockManager *blockman)

{
  long lVar1;
  undefined1 uVar2;
  AnnotatedMixin<std::recursive_mutex> *in_RCX;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDX;
  long in_RSI;
  undefined1 in_DIL;
  long in_FS_OFFSET;
  CBlockUndo block_undo;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  CBlock block;
  CBlock *in_stack_fffffffffffffe98;
  CBlockIndex *in_stack_fffffffffffffea0;
  undefined5 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffead;
  undefined1 in_stack_fffffffffffffeae;
  CBlock *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  char *in_stack_fffffffffffffec8;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  byte bVar3;
  CBlock *in_stack_fffffffffffffef0;
  BlockFilterType in_stack_fffffffffffffeff;
  BlockFilter *in_stack_ffffffffffffff00;
  CBlockIndex *in_stack_ffffffffffffff18;
  CBlockUndo *in_stack_ffffffffffffff20;
  BlockManager *in_stack_ffffffffffffff28;
  FlatFilePos *in_stack_ffffffffffffff58;
  CBlock *in_stack_ffffffffffffff60;
  BlockManager *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe98);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_RDX,in_RCX,in_stack_fffffffffffffec8,
             (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x18,0));
  CBlock::CBlock(in_stack_fffffffffffffeb8);
  CBlockIndex::GetBlockPos(in_stack_fffffffffffffea0);
  uVar2 = node::BlockManager::ReadBlockFromDisk
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (((uVar2 ^ 0xff) & 1) != 0) {
    bVar3 = 0;
    goto LAB_00e9f0df;
  }
  CBlockUndo::CBlockUndo((CBlockUndo *)in_stack_fffffffffffffe98);
  if (*(int *)(in_RSI + 0x18) < 1) {
LAB_00e9f088:
    BlockFilter::BlockFilter
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffeff,in_stack_fffffffffffffef0,
               (CBlockUndo *)
               CONCAT17(in_stack_fffffffffffffeef,CONCAT16(in_DIL,in_stack_fffffffffffffee8)));
    BlockFilter::operator=
              ((BlockFilter *)
               CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffeae,
                                       CONCAT15(in_stack_fffffffffffffead,in_stack_fffffffffffffea8)
                                      )),(BlockFilter *)in_stack_fffffffffffffea0);
    BlockFilter::~BlockFilter((BlockFilter *)in_stack_fffffffffffffe98);
    bVar3 = 1;
  }
  else {
    in_stack_fffffffffffffeae =
         node::BlockManager::UndoReadFromDisk
                   (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if ((bool)in_stack_fffffffffffffeae) goto LAB_00e9f088;
    bVar3 = 0;
  }
  CBlockUndo::~CBlockUndo((CBlockUndo *)in_stack_fffffffffffffe98);
LAB_00e9f0df:
  CBlock::~CBlock(in_stack_fffffffffffffe98);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool ComputeFilter(BlockFilterType filter_type, const CBlockIndex& block_index, BlockFilter& filter, const BlockManager& blockman)
{
    LOCK(::cs_main);

    CBlock block;
    if (!blockman.ReadBlockFromDisk(block, block_index.GetBlockPos())) {
        return false;
    }

    CBlockUndo block_undo;
    if (block_index.nHeight > 0 && !blockman.UndoReadFromDisk(block_undo, block_index)) {
        return false;
    }

    filter = BlockFilter(filter_type, block, block_undo);
    return true;
}